

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O0

void __thiscall CppLogger::CppLogger::setColor(CppLogger *this,Level t_Level,string *t_Color)

{
  string *t_Color_local;
  Level t_Level_local;
  CppLogger *this_local;
  
  switch(t_Level) {
  case None:
    break;
  case Trace:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->m_TraceColor,t_Color);
    break;
  case Info:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->m_InfoColor,t_Color);
    break;
  case Warn:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->m_WarnColor,t_Color);
    break;
  case Error:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->m_ErrorColor,t_Color);
    break;
  case FatalError:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->m_FatalErrorColor,t_Color);
  }
  return;
}

Assistant:

void CppLogger::setColor(Level t_Level, std::string t_Color){
        switch (t_Level) {
            case Level::None:
                break;
            case Level::Trace:
                m_TraceColor = t_Color;
                break;
            case Level::Info:
                m_InfoColor = t_Color;
                break;
            case Level::Warn:
                m_WarnColor = t_Color;
                break;
            case Level::Error:
                m_ErrorColor = t_Color;
                break;
            case Level::FatalError:
                m_FatalErrorColor = t_Color;
                break;
        }
    }